

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zreadhb.c
# Opt level: O1

int zParseIntFormat(char *buf,int *num,int *size)

{
  byte bVar1;
  byte *pbVar2;
  
  do {
    bVar1 = *buf;
    buf = (char *)((byte *)buf + 1);
  } while (bVar1 != 0x28);
  __isoc99_sscanf(buf,"%d",num);
  do {
    pbVar2 = (byte *)buf + 1;
    bVar1 = *buf;
    buf = (char *)pbVar2;
  } while ((bVar1 | 0x20) != 0x69);
  __isoc99_sscanf(pbVar2,"%d",size);
  return 0;
}

Assistant:

int zParseIntFormat(char *buf, int *num, int *size)
{
    char *tmp;

    tmp = buf;
    while (*tmp++ != '(') ;
    sscanf(tmp, "%d", num);
    while (*tmp != 'I' && *tmp != 'i') ++tmp;
    ++tmp;
    sscanf(tmp, "%d", size);
    return 0;
}